

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O2

uint16_t __thiscall capnp::DynamicEnum::asImpl(DynamicEnum *this,uint64_t requestedTypeId)

{
  uint64_t uVar1;
  Fault f;
  uint64_t *local_38;
  uint local_28;
  
  Schema::getProto((Reader *)&f,(Schema *)this);
  if (local_28 < 0x40) {
    uVar1 = 0;
  }
  else {
    uVar1 = *local_38;
  }
  if (uVar1 != requestedTypeId) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[35]>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x78,FAILED,"requestedTypeId == schema.getProto().getId()",
               "\"Type mismatch in DynamicEnum.as().\"",
               (char (*) [35])"Type mismatch in DynamicEnum.as().");
    kj::_::Debug::Fault::~Fault(&f);
  }
  return this->value;
}

Assistant:

uint16_t DynamicEnum::asImpl(uint64_t requestedTypeId) const {
  KJ_REQUIRE(requestedTypeId == schema.getProto().getId(),
             "Type mismatch in DynamicEnum.as().") {
    // use it anyway
    break;
  }
  return value;
}